

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IEnumerableCore.hpp
# Opt level: O0

IEnumerableCore<linq::ExceptState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:137:13),_int>_>
* __thiscall
linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>::
Except<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>&>
          (IEnumerableCore<linq::ExceptState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:137:13),_int>_>
           *__return_storage_ptr__,
          IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>
          *this,IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>
                *other)

{
  ExceptState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:137:13),_int>
  local_e8;
  anon_class_1_0_00000001_for_transformer local_21;
  IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>
  *pIStack_20;
  anon_class_1_0_00000001_for_transformer f;
  IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>
  *other_local;
  IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>
  *this_local;
  
  pIStack_20 = other;
  ExceptState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:137:13),_int>
  ::ExceptState(&local_e8,(ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int> *)this,
                other,&local_21);
  IEnumerableCore<linq::ExceptState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:137:13),_int>_>
  ::IEnumerableCore(__return_storage_ptr__,&local_e8);
  ExceptState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:137:13),_int>
  ::~ExceptState(&local_e8);
  return __return_storage_ptr__;
}

Assistant:

auto Except(O&& other)
		{
			using S2 = typename std::remove_reference<O>::type;
			using TS = typename std::remove_reference<T>::type;
			auto f = [](TS x) { return x; };
			using F = decltype(f);
			return IEnumerableCore<ExceptState<S, S2, F, TS>>(ExceptState<S, S2, F, TS>(std::move(source), std::move(other), f));
		}